

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

wl_buffer * createShmBuffer(GLFWimage *image)

{
  byte bVar1;
  uchar *puVar2;
  wl_shm *pwVar3;
  PFN_wl_proxy_marshal_flags p_Var4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  char *__dest;
  void *__addr;
  wl_proxy *pwVar8;
  wl_proxy *pwVar9;
  int *piVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  size_t sVar15;
  
  iVar14 = image->width * 4;
  uVar12 = image->height * iVar14;
  iVar5 = memfd_create("glfw-shared",3);
  if (iVar5 < 0) {
    pcVar11 = getenv("XDG_RUNTIME_DIR");
    if (pcVar11 != (char *)0x0) {
      sVar15 = strlen(pcVar11);
      __dest = (char *)_glfw_calloc(sVar15 + 0x14,1);
      strcpy(__dest,pcVar11);
      sVar15 = strlen(__dest);
      builtin_strncpy(__dest + sVar15,"/glfw-shared-XXXXXX",0x14);
      iVar5 = mkostemp(__dest,0x80000);
      if (-1 < iVar5) {
        unlink(__dest);
      }
      _glfw_free(__dest);
      if (iVar5 < 0) {
        piVar10 = __errno_location();
        goto LAB_001256dc;
      }
      goto LAB_001254b3;
    }
    iVar6 = 2;
  }
  else {
    fcntl(iVar5,0x409,3);
LAB_001254b3:
    sVar15 = (size_t)(int)uVar12;
    iVar6 = posix_fallocate(iVar5,0,sVar15);
    if (iVar6 == 0) {
      __addr = mmap((void *)0x0,sVar15,3,1,iVar5,0);
      p_Var4 = _glfw.wl.client.proxy_marshal_flags;
      pwVar3 = _glfw.wl.shm;
      if (__addr == (void *)0xffffffffffffffff) {
        piVar10 = __errno_location();
        pcVar11 = strerror(*piVar10);
        _glfwInputError(0x10008,"Wayland: Failed to map file: %s",pcVar11);
        close(iVar5);
        return (wl_buffer *)0x0;
      }
      uVar7 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.shm);
      pwVar8 = (*p_Var4)((wl_proxy *)pwVar3,0,&_glfw_wl_shm_pool_interface,uVar7,0,0,iVar5,uVar12);
      close(iVar5);
      puVar2 = image->pixels;
      lVar13 = 0;
      while( true ) {
        p_Var4 = _glfw.wl.client.proxy_marshal_flags;
        iVar5 = image->width;
        iVar6 = image->height;
        if (iVar6 * iVar5 <= (int)lVar13) break;
        bVar1 = puVar2[lVar13 * 4 + 3];
        *(char *)((long)__addr + lVar13 * 4) =
             (char)(((uint)puVar2[lVar13 * 4 + 2] * (uint)bVar1) / 0xff);
        *(char *)((long)__addr + lVar13 * 4 + 1) =
             (char)(((uint)puVar2[lVar13 * 4 + 1] * (uint)bVar1) / 0xff);
        *(char *)((long)__addr + lVar13 * 4 + 2) =
             (char)(((uint)puVar2[lVar13 * 4] * (uint)bVar1) / 0xff);
        *(byte *)((long)__addr + lVar13 * 4 + 3) = bVar1;
        lVar13 = lVar13 + 1;
      }
      uVar7 = (*_glfw.wl.client.proxy_get_version)(pwVar8);
      pwVar9 = (*p_Var4)(pwVar8,0,&_glfw_wl_buffer_interface,uVar7,0,0,0,iVar5,iVar6,iVar14,0);
      munmap(__addr,sVar15);
      p_Var4 = _glfw.wl.client.proxy_marshal_flags;
      uVar7 = (*_glfw.wl.client.proxy_get_version)(pwVar8);
      (*p_Var4)(pwVar8,1,(wl_interface *)0x0,uVar7,1);
      return (wl_buffer *)pwVar9;
    }
    close(iVar5);
  }
  piVar10 = __errno_location();
  *piVar10 = iVar6;
LAB_001256dc:
  pcVar11 = strerror(*piVar10);
  _glfwInputError(0x10008,"Wayland: Failed to create buffer file of size %d: %s",(ulong)uVar12,
                  pcVar11);
  return (wl_buffer *)0x0;
}

Assistant:

static struct wl_buffer* createShmBuffer(const GLFWimage* image)
{
    const int stride = image->width * 4;
    const int length = image->width * image->height * 4;

    const int fd = createAnonymousFile(length);
    if (fd < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create buffer file of size %d: %s",
                        length, strerror(errno));
        return NULL;
    }

    void* data = mmap(NULL, length, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if (data == MAP_FAILED)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to map file: %s", strerror(errno));
        close(fd);
        return NULL;
    }

    struct wl_shm_pool* pool = wl_shm_create_pool(_glfw.wl.shm, fd, length);

    close(fd);

    unsigned char* source = (unsigned char*) image->pixels;
    unsigned char* target = data;
    for (int i = 0;  i < image->width * image->height;  i++, source += 4)
    {
        unsigned int alpha = source[3];

        *target++ = (unsigned char) ((source[2] * alpha) / 255);
        *target++ = (unsigned char) ((source[1] * alpha) / 255);
        *target++ = (unsigned char) ((source[0] * alpha) / 255);
        *target++ = (unsigned char) alpha;
    }

    struct wl_buffer* buffer =
        wl_shm_pool_create_buffer(pool, 0,
                                  image->width,
                                  image->height,
                                  stride, WL_SHM_FORMAT_ARGB8888);
    munmap(data, length);
    wl_shm_pool_destroy(pool);

    return buffer;
}